

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compute_scalar_product_of_persistence_vectors.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer pdVar1;
  ostream *poVar2;
  size_type sVar3;
  reference ppcVar4;
  pointer pdVar5;
  reference pvVar6;
  reference this;
  reference second_vector;
  reference pvVar7;
  double dVar8;
  size_type local_320;
  size_t j_1;
  size_t i_3;
  ofstream out;
  size_type local_110;
  size_t j;
  size_t i_2;
  value_type_conflict1 local_f8;
  undefined1 local_f0 [8];
  vector<double,_std::allocator<double>_> v;
  size_t i_1;
  undefined1 local_c8 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  scalar_product;
  Vector_distances_in_diagram l;
  size_t file_no;
  vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
  vectors;
  int local_34;
  undefined1 local_30 [4];
  int i;
  vector<const_char_*,_std::allocator<const_char_*>_> filenames;
  char **argv_local;
  int argc_local;
  
  filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = argv;
  poVar2 = std::operator<<((ostream *)&std::clog,
                           "This program computes scalar product of persistence vectors stored in a file (the file needs to "
                          );
  poVar2 = std::operator<<(poVar2,"be created beforehand). \n");
  std::operator<<(poVar2,
                  "The parameters of this programs are names of files with persistence vectors.\n");
  if (argc < 3) {
    std::operator<<((ostream *)&std::clog,
                    "Wrong number of parameters, the program will now terminate \n");
    argv_local._4_4_ = 1;
  }
  else {
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30);
    for (local_34 = 1; local_34 < argc; local_34 = local_34 + 1) {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30,
                 filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + local_34);
    }
    std::
    vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
    ::vector((vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
              *)&file_no);
    sVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                      ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30);
    std::
    vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
    ::reserve((vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
               *)&file_no,sVar3);
    l.where_to_cut = 0;
    while( true ) {
      sVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30);
      if (l.where_to_cut == sVar3) break;
      Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>::
      Vector_distances_in_diagram
                ((Vector_distances_in_diagram<Gudhi::Euclidean_distance> *)
                 &scalar_product.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30,
                           l.where_to_cut);
      Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>::
      load_from_file((Vector_distances_in_diagram<Gudhi::Euclidean_distance> *)
                     &scalar_product.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,*ppcVar4);
      std::
      vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
      ::push_back((vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
                   *)&file_no,
                  (value_type *)
                  &scalar_product.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>::
      ~Vector_distances_in_diagram
                ((Vector_distances_in_diagram<Gudhi::Euclidean_distance> *)
                 &scalar_product.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      l.where_to_cut = l.where_to_cut + 1;
    }
    sVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                      ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30);
    std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
              ((allocator<std::vector<double,_std::allocator<double>_>_> *)((long)&i_1 + 7));
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)local_c8,sVar3,
             (allocator<std::vector<double,_std::allocator<double>_>_> *)((long)&i_1 + 7));
    std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
              ((allocator<std::vector<double,_std::allocator<double>_>_> *)((long)&i_1 + 7));
    v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    while( true ) {
      pdVar1 = v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage;
      pdVar5 = (pointer)std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30);
      if (pdVar1 == pdVar5) break;
      sVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30);
      local_f8 = 0.0;
      std::allocator<double>::allocator((allocator<double> *)((long)&i_2 + 7));
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_f0,sVar3,&local_f8,
                 (allocator<double> *)((long)&i_2 + 7));
      std::allocator<double>::~allocator((allocator<double> *)((long)&i_2 + 7));
      pvVar6 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)local_c8,
                            (size_type)
                            v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::operator=
                (pvVar6,(vector<double,_std::allocator<double>_> *)local_f0);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_f0);
      v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)((long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 1);
    }
    j = 0;
    while( true ) {
      sVar3 = std::
              vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
              ::size((vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
                      *)&file_no);
      if (j == sVar3) break;
      local_110 = j;
      while( true ) {
        sVar3 = std::
                vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
                ::size((vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
                        *)&file_no);
        if (local_110 == sVar3) break;
        this = std::
               vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
               ::operator[]((vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
                             *)&file_no,j);
        second_vector =
             std::
             vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
             ::operator[]((vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
                           *)&file_no,local_110);
        dVar8 = Gudhi::Persistence_representations::
                Vector_distances_in_diagram<Gudhi::Euclidean_distance>::compute_scalar_product
                          (this,second_vector);
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)local_c8,local_110);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,j);
        *pvVar7 = dVar8;
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)local_c8,j);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,local_110);
        *pvVar7 = dVar8;
        local_110 = local_110 + 1;
      }
      j = j + 1;
    }
    std::ofstream::ofstream(&i_3);
    std::ofstream::open(&i_3,"scalar_product.vect",0x10);
    j_1 = 0;
    while( true ) {
      sVar3 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)local_c8);
      if (j_1 == sVar3) break;
      local_320 = 0;
      while( true ) {
        sVar3 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        *)local_c8);
        if (local_320 == sVar3) break;
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)local_c8,j_1);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,local_320);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::clog,*pvVar7);
        std::operator<<(poVar2," ");
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)local_c8,j_1);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,local_320);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&i_3,*pvVar7);
        std::operator<<(poVar2," ");
        local_320 = local_320 + 1;
      }
      std::ostream::operator<<((ostream *)&std::clog,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<((ostream *)&i_3,std::endl<char,std::char_traits<char>>);
      j_1 = j_1 + 1;
    }
    std::ofstream::close();
    std::operator<<((ostream *)&std::clog,"Distance can be found in \'scalar_product.vect\' file\n")
    ;
    argv_local._4_4_ = 0;
    std::ofstream::~ofstream(&i_3);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)local_c8);
    std::
    vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
    ::~vector((vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
               *)&file_no);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv) {
  std::clog << "This program computes scalar product of persistence vectors stored in a file (the file needs to "
            << "be created beforehand). \n"
            << "The parameters of this programs are names of files with persistence vectors.\n";

  if (argc < 3) {
    std::clog << "Wrong number of parameters, the program will now terminate \n";
    return 1;
  }

  std::vector<const char*> filenames;
  for (int i = 1; i < argc; ++i) {
    filenames.push_back(argv[i]);
  }
  std::vector<Vector_distances_in_diagram> vectors;
  vectors.reserve(filenames.size());
  for (size_t file_no = 0; file_no != filenames.size(); ++file_no) {
    Vector_distances_in_diagram l;
    l.load_from_file(filenames[file_no]);
    vectors.push_back(l);
  }

  // and now we will compute the scalar product of landscapes.

  // first we prepare an array:
  std::vector<std::vector<double> > scalar_product(filenames.size());
  for (size_t i = 0; i != filenames.size(); ++i) {
    std::vector<double> v(filenames.size(), 0);
    scalar_product[i] = v;
  }

  // and now we can compute the scalar product:
  for (size_t i = 0; i != vectors.size(); ++i) {
    for (size_t j = i; j != vectors.size(); ++j) {
      scalar_product[i][j] = scalar_product[j][i] = vectors[i].compute_scalar_product(vectors[j]);
    }
  }

  // and now output the result to the screen and a file:
  std::ofstream out;
  out.open("scalar_product.vect");
  for (size_t i = 0; i != scalar_product.size(); ++i) {
    for (size_t j = 0; j != scalar_product.size(); ++j) {
      std::clog << scalar_product[i][j] << " ";
      out << scalar_product[i][j] << " ";
    }
    std::clog << std::endl;
    out << std::endl;
  }
  out.close();

  std::clog << "Distance can be found in 'scalar_product.vect' file\n";
  return 0;
}